

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O1

void __thiscall
Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
MarshalCrossSite_TTDInflate
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (*(long *)&(this->super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>).
                super_ScriptFunctionWithInlineCache.super_ScriptFunction.super_ScriptFunctionBase.
                super_JavascriptFunction.super_DynamicObject.super_RecyclableObject !=
      VirtualTableInfo<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>_>
      ::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x23,
                                "(VirtualTableInfo<FunctionWithComputedName<BaseClass>>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *(INT_PTR *)
   &(this->super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>).
    super_ScriptFunctionWithInlineCache.super_ScriptFunction.super_ScriptFunctionBase.
    super_JavascriptFunction.super_DynamicObject.super_RecyclableObject =
       VirtualTableInfo<Js::CrossSiteObject<Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>_>_>
       ::Address;
  return;
}

Assistant:

FunctionWithComputedName(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), computedNameVar(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasComputedName());
        }